

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_formatting.c
# Opt level: O1

char * double_all_percent_signs_in(char *original)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar2 = strchr(original,0x25);
  lVar6 = 1;
  pcVar3 = pcVar2;
  while (pcVar3 != (char *)0x0) {
    pcVar3 = strchr(pcVar3 + 1,0x25);
    lVar6 = lVar6 + 1;
  }
  sVar4 = strlen(original);
  pcVar5 = (char *)malloc(lVar6 + sVar4);
  pcVar3 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    while (pcVar2 != (char *)0x0) {
      memcpy(pcVar3,original,(size_t)(pcVar2 + (1 - (long)original)));
      pcVar1 = pcVar2 + (2 - (long)original);
      pcVar3[(long)(pcVar2 + (1 - (long)original))] = '%';
      original = pcVar2 + 1;
      pcVar2 = strchr(original,0x25);
      pcVar3 = pcVar3 + (long)pcVar1;
    }
    strcpy(pcVar3,original);
  }
  return pcVar5;
}

Assistant:

static char *double_all_percent_signs_in(const char *original)
{
    size_t percent_count = count_percent_signs(original);
    char *new_string = (char *)malloc(strlen(original) + percent_count + 1);
    if (new_string == NULL) {
        return NULL;
    }
    copy_while_doubling_percent_signs(new_string, original);
    return new_string;
}